

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O1

string * __thiscall
cfd::core::ScriptElement::ToString_abi_cxx11_(string *__return_storage_ptr__,ScriptElement *this)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  uint __len;
  ulong __val;
  
  if (this->type_ == kElementNumber) {
    uVar1 = this->value_;
    __val = -uVar1;
    if (0 < (long)uVar1) {
      __val = uVar1;
    }
    __len = 1;
    if (9 < __val) {
      uVar5 = __val;
      uVar3 = 4;
      do {
        __len = uVar3;
        if (uVar5 < 100) {
          __len = __len - 2;
          goto LAB_004474b2;
        }
        if (uVar5 < 1000) {
          __len = __len - 1;
          goto LAB_004474b2;
        }
        if (uVar5 < 10000) goto LAB_004474b2;
        bVar2 = 99999 < uVar5;
        uVar5 = uVar5 / 10000;
        uVar3 = __len + 4;
      } while (bVar2);
      __len = __len + 1;
    }
LAB_004474b2:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct
              ((ulong)__return_storage_ptr__,(char)__len - (char)((long)uVar1 >> 0x3f));
    ::std::__detail::__to_chars_10_impl<unsigned_long>
              ((__return_storage_ptr__->_M_dataplus)._M_p + -((long)uVar1 >> 0x3f),__len,__val);
  }
  else {
    if (this->type_ == kElementBinary) {
      sVar4 = ByteData::GetDataSize(&this->binary_data_);
      if (sVar4 != 0) {
        ByteData::GetHex_abi_cxx11_(__return_storage_ptr__,&this->binary_data_);
        return __return_storage_ptr__;
      }
    }
    else if ((this->op_code_).data_type_ != kOpInvalidOpCode) {
      ScriptOperator::ToString_abi_cxx11_(__return_storage_ptr__,&this->op_code_);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ScriptElement::ToString() const {
  switch (type_) {
    case kElementBinary:
      if (binary_data_.GetDataSize() == 0) {
        return "";
      } else {
        return binary_data_.GetHex();
      }
    case kElementNumber: {
      return std::to_string(value_);
    }
    case kElementOpCode:
    default: {
      if (op_code_.GetDataType() != kOpInvalidOpCode) {
        return op_code_.ToString();
      }
      break;
    }
  }
  return "";
}